

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

FrameList_ * __thiscall rw::FrameList_::streamRead(FrameList_ *this,Stream *stream)

{
  FILE *pFVar1;
  bool bVar2;
  int32 iVar3;
  char *pcVar4;
  Frame **ppFVar5;
  Frame *child;
  int local_7c;
  int32 i_1;
  Frame *f;
  uint32 local_68;
  int32 i;
  Error _e_1;
  Error _e;
  FrameStreamData buf;
  Stream *stream_local;
  FrameList_ *this_local;
  
  this->numFrames = 0;
  this->frames = (Frame **)0x0;
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    iVar3 = Stream::readI32(stream);
    this->numFrames = iVar3;
    ppFVar5 = (Frame **)
              malloc_LOC((long)this->numFrames << 3,0x3000e,
                         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/frame.cpp line: 377"
                        );
    this->frames = ppFVar5;
    if (this->frames == (Frame **)0x0) {
      local_68 = 0xe;
      i = -0x7ffffffe;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/frame.cpp",0x17b);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x80000002,(long)this->numFrames << 3);
      fprintf(pFVar1,"%s\n",pcVar4);
      setError((Error *)&stack0xffffffffffffff98);
      this_local = (FrameList_ *)0x0;
    }
    else {
      for (f._4_4_ = 0; f._4_4_ < this->numFrames; f._4_4_ = f._4_4_ + 1) {
        Stream::read32(stream,&_e,0x38);
        child = Frame::create();
        this->frames[f._4_4_] = child;
        if (child == (Frame *)0x0) {
          (*DAT_001660a8)(this->frames);
          return (FrameList_ *)0x0;
        }
        (child->matrix).right.x = (float32)_e.plugin;
        (child->matrix).right.y = (float32)_e.code;
        (child->matrix).right.z = buf.right.x;
        (child->matrix).up.x = buf.right.y;
        (child->matrix).up.y = buf.right.z;
        (child->matrix).up.z = buf.up.x;
        (child->matrix).at.x = buf.up.y;
        (child->matrix).at.y = buf.up.z;
        (child->matrix).at.z = buf.at.x;
        (child->matrix).pos.x = buf.at.y;
        (child->matrix).pos.y = buf.at.z;
        (child->matrix).pos.z = buf.pos.x;
        Matrix::optimize(&child->matrix,(Tolerance *)0x0);
        (child->matrix).flags = (child->matrix).flags & 0xfffdffff;
        if (-1 < (int)buf.pos.y) {
          Frame::addChild(this->frames[(int)buf.pos.y],child,streamAppendFrames);
        }
      }
      for (local_7c = 0; this_local = this, local_7c < this->numFrames; local_7c = local_7c + 1) {
        PluginList::streamRead((PluginList *)&Frame::s_plglist,stream,this->frames[local_7c]);
      }
    }
  }
  else {
    _e_1.plugin = 0xe;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/frame.cpp",0x175);
    pFVar1 = _stderr;
    pcVar4 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar4);
    setError(&_e_1);
    this_local = (FrameList_ *)0x0;
  }
  return this_local;
}

Assistant:

FrameList_*
FrameList_::streamRead(Stream *stream)
{
	FrameStreamData buf;
	this->numFrames = 0;
	this->frames = nil;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	this->numFrames = stream->readI32();
	this->frames = (Frame**)rwMalloc(this->numFrames*sizeof(Frame*), MEMDUR_EVENT | ID_FRAMELIST);
	if(this->frames == nil){
		RWERROR((ERR_ALLOC, this->numFrames*sizeof(Frame*)));
		return nil;
	}
	for(int32 i = 0; i < this->numFrames; i++){
		Frame *f;
		stream->read32(&buf, sizeof(buf));
		this->frames[i] = f = Frame::create();
		if(f == nil){
			// TODO: clean up frames?
			rwFree(this->frames);
			return nil;
		}
		f->matrix.right = buf.right;
		f->matrix.up = buf.up;
		f->matrix.at = buf.at;
		f->matrix.pos = buf.pos;
		f->matrix.optimize();
		// RW always removes identity flag
		f->matrix.flags &= ~Matrix::IDENTITY;
		if(buf.parent >= 0)
			this->frames[buf.parent]->addChild(f, rw::streamAppendFrames);
	}
	for(int32 i = 0; i < this->numFrames; i++)
		Frame::s_plglist.streamRead(stream, this->frames[i]);
	return this;
}